

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O3

void __thiscall
ktx::ValidationContext::validateKTXorientation(ValidationContext *this,uint8_t *data,uint32_t size)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  string_view value;
  char local_3a [2];
  ulong local_38;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  this->foundKTXorientation = true;
  if ((size == 0) || (data[size - 1] != '\0')) {
    error<>(this,&Metadata::KTXorientationMissingNull);
    iVar2 = 0;
  }
  else {
    iVar2 = -1;
  }
  uVar3 = iVar2 + size;
  local_30._M_len = (size_t)uVar3;
  uVar1 = uVar3;
  local_30._M_str = (char *)data;
  if (uVar3 != this->dimensionCount) {
    local_38 = local_30._M_len;
    error<unsigned_long,unsigned_int&>
              (this,&Metadata::KTXorientationIncorrectDimension,&local_38,&this->dimensionCount);
    uVar1 = this->dimensionCount;
  }
  if (((uVar1 != 0 && uVar3 != 0) && (*data != 'l')) && (*data != 'r')) {
    local_38 = local_38 & 0xffffffff00000000;
    local_3a[1] = 0x72;
    local_3a[0] = 'l';
    error<int,char_const&,char,char>
              (this,&Metadata::KTXorientationInvalidValue,(int *)&local_38,(char *)data,local_3a + 1
               ,local_3a);
    uVar1 = this->dimensionCount;
  }
  if (((1 < uVar1 && 1 < uVar3) && (data[1] != 'd')) && (data[1] != 'u')) {
    local_38 = CONCAT44(local_38._4_4_,1);
    local_3a[1] = 100;
    local_3a[0] = 'u';
    error<int,char_const&,char,char>
              (this,&Metadata::KTXorientationInvalidValue,(int *)&local_38,(char *)(data + 1),
               local_3a + 1,local_3a);
    uVar1 = this->dimensionCount;
  }
  if (((2 < uVar3) && (2 < uVar1)) && ((data[2] != 'i' && (data[2] != 'o')))) {
    local_38 = CONCAT44(local_38._4_4_,2);
    local_3a[1] = 0x6f;
    local_3a[0] = 'i';
    error<int,char_const&,char,char>
              (this,&Metadata::KTXorientationInvalidValue,(int *)&local_38,(char *)(data + 2),
               local_3a + 1,local_3a);
  }
  if ((this->checkGLTFBasisU == true) && ((uVar3 != 2 || (*(short *)data != 0x6472)))) {
    error<std::basic_string_view<char,std::char_traits<char>>const&>
              (this,&Metadata::KTXorientationInvalidGLTFBU,&local_30);
  }
  return;
}

Assistant:

void ValidationContext::validateKTXorientation(const uint8_t* data, uint32_t size) {
    foundKTXorientation = true;

    const auto hasNull = size > 0 && data[size - 1] == '\0';
    if (!hasNull)
        error(Metadata::KTXorientationMissingNull);

    const auto value = std::string_view(reinterpret_cast<const char*>(data), hasNull ? size - 1 : size);

    if (value.size() != dimensionCount)
        error(Metadata::KTXorientationIncorrectDimension, value.size(), dimensionCount);

    if (value.size() > 0 && dimensionCount > 0 && value[0] != 'r' && value[0] != 'l')
        error(Metadata::KTXorientationInvalidValue, 0, value[0], 'r', 'l');

    if (value.size() > 1 && dimensionCount > 1 && value[1] != 'd' && value[1] != 'u')
        error(Metadata::KTXorientationInvalidValue, 1, value[1], 'd', 'u');

    if (value.size() > 2 && dimensionCount > 2 && value[2] != 'o' && value[2] != 'i')
        error(Metadata::KTXorientationInvalidValue, 2, value[2], 'o', 'i');

    if (checkGLTFBasisU && value != "rd")
        error(Metadata::KTXorientationInvalidGLTFBU, value);
}